

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PP_graph.h
# Opt level: O1

void __thiscall PP_edge::PP_edge(PP_edge *this,PP_edge *other)

{
  pointer pPVar1;
  pointer pPVar2;
  
  this->_vptr_PP_edge = (_func_int **)&PTR__PP_edge_00116c48;
  (this->p1)._vptr_PP_point = (_func_int **)&PTR__PP_point_00116c18;
  (this->p1).e.super__Vector_base<PP_edge,_std::allocator<PP_edge>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  (this->p1).e.super__Vector_base<PP_edge,_std::allocator<PP_edge>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  (this->p1).e.super__Vector_base<PP_edge,_std::allocator<PP_edge>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  (this->p1).x = 0.0;
  (this->p1).y = 0.0;
  (this->p1).z = 0.0;
  (this->p1).canBePartOfGraph = true;
  pPVar1 = (this->p1).e.super__Vector_base<PP_edge,_std::allocator<PP_edge>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pPVar1 != (pointer)0x0) {
    pPVar2 = (pointer)0x0;
    do {
      (**pPVar2->_vptr_PP_edge)(pPVar2);
      pPVar2 = pPVar2 + 1;
    } while (pPVar2 != pPVar1);
    (this->p1).e.super__Vector_base<PP_edge,_std::allocator<PP_edge>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
  }
  (this->p2)._vptr_PP_point = (_func_int **)&PTR__PP_point_00116c18;
  (this->p2).e.super__Vector_base<PP_edge,_std::allocator<PP_edge>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  (this->p2).e.super__Vector_base<PP_edge,_std::allocator<PP_edge>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  (this->p2).e.super__Vector_base<PP_edge,_std::allocator<PP_edge>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  (this->p2).x = 0.0;
  (this->p2).y = 0.0;
  (this->p2).z = 0.0;
  (this->p2).canBePartOfGraph = true;
  pPVar1 = (this->p2).e.super__Vector_base<PP_edge,_std::allocator<PP_edge>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pPVar1 != (pointer)0x0) {
    pPVar2 = (pointer)0x0;
    do {
      (**pPVar2->_vptr_PP_edge)(pPVar2);
      pPVar2 = pPVar2 + 1;
    } while (pPVar2 != pPVar1);
    (this->p2).e.super__Vector_base<PP_edge,_std::allocator<PP_edge>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
  }
  PP_point::operator=(&this->p1,&other->p1);
  PP_point::operator=(&this->p2,&other->p2);
  this->distp1p2 = other->distp1p2;
  return;
}

Assistant:

PP_edge( const PP_edge& other )
    {
        this->p1 = other.p1;
        this->p2 = other.p2;
        this->distp1p2 = other.distp1p2;
    }